

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_transaction.cpp
# Opt level: O0

void cfd::api::json::TransactionJsonApi::DecodeRawTransaction
               (DecodeRawTransactionRequest *request,DecodeRawTransactionResponse *response)

{
  DecodeRawTransactionResponse *pDVar1;
  bool bVar2;
  NetType NVar3;
  undefined8 uVar4;
  ulong uVar5;
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pJVar6;
  reference object;
  DecodeRawTransactionResponse *in_RSI;
  long in_RDI;
  Amount AVar7;
  Address addr;
  iterator __end4_1;
  iterator __begin4_1;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *__range4_1;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> addr_list;
  string script_type;
  int64_t require_num;
  AddressFactory addr_factory;
  Script locking_script;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addresses;
  DecodeLockingScript script_pub_key_res;
  DecodeRawTransactionTxOut res_txout;
  TxOutReference *txout_ref;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *__range2_1;
  int32_t txout_count;
  ByteData *witness;
  const_iterator __end4;
  const_iterator __begin4;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__range4;
  DecodeRawTransactionTxIn res_txin;
  TxInReference *tx_in_ref;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *__range2;
  Transaction tx;
  NetType net_type;
  string *hex_string;
  DecodeLockingScript *in_stack_fffffffffffff2f8;
  Address *in_stack_fffffffffffff300;
  value_type *in_stack_fffffffffffff308;
  DecodeRawTransactionTxIn *in_stack_fffffffffffff310;
  undefined8 in_stack_fffffffffffff318;
  CfdError error_code;
  allocator *paVar8;
  DecodeRawTransactionTxOut *in_stack_fffffffffffff320;
  DecodeRawTransactionTxIn *in_stack_fffffffffffff350;
  string *in_stack_fffffffffffff360;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  string local_ba8;
  Address local_b88;
  Address *local_a10;
  __normal_iterator<cfd::core::Address_*,_std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>_>
  local_a08;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *local_a00;
  undefined1 local_9f1 [40];
  allocator local_9c9;
  string local_9c8 [36];
  int local_9a4;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> local_9a0;
  undefined1 local_988 [80];
  string local_938;
  string local_918;
  Script local_8f8;
  DecodeLockingScript local_8a8;
  uint32_t local_7e4;
  int64_t local_7e0;
  undefined1 local_7d8;
  Amount local_7d0;
  int64_t local_7c0;
  DecodeRawTransactionTxOut local_7b8;
  AbstractTxOutReference *local_6b0;
  TxOutReference *local_6a8;
  __normal_iterator<const_cfd::core::TxOutReference_*,_std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>_>
  local_6a0;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> local_698;
  vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *local_680;
  uint32_t local_674;
  uint32_t local_670;
  undefined1 local_669 [33];
  string local_648;
  ByteData *local_628;
  __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
  local_620;
  __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
  local_618;
  ScriptWitness local_610;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_5f0;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *local_5d8;
  Script local_5d0;
  string local_598;
  Script local_578;
  string local_540;
  Script local_520;
  uint32_t local_4e4;
  Txid local_4e0;
  string local_4c0;
  allocator local_499;
  string local_498 [32];
  Script local_478;
  string local_440;
  Script local_420;
  allocator local_3e1;
  string local_3e0 [39];
  allocator local_3b9;
  string local_3b8 [39];
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [32];
  DecodeRawTransactionTxIn local_348;
  AbstractTxInReference *local_228;
  undefined4 local_21c;
  TxInReference *local_218;
  __normal_iterator<const_cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
  local_210;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> local_208;
  vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *local_1f0;
  uint32_t local_1e4;
  uint32_t local_1e0;
  uint32_t local_1dc;
  uint32_t local_1d8;
  uint32_t local_1d4;
  ByteData256 local_1d0;
  Txid local_1b8;
  string local_198;
  Txid local_178;
  string local_158;
  Transaction local_138;
  string local_f8 [32];
  NetType local_d8;
  undefined1 local_d2;
  allocator local_d1;
  int64_t *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  Script *in_stack_ffffffffffffff40;
  AddressFactory *in_stack_ffffffffffffff48;
  CfdSourceLocation local_b0;
  string local_98;
  string *local_78;
  undefined1 local_6a;
  allocator local_69;
  string local_68 [35];
  undefined1 local_45;
  allocator local_31;
  string local_30 [32];
  DecodeRawTransactionResponse *local_10;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffff318 >> 0x20);
  if (in_RDI == 0) {
    local_45 = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"request is null.",&local_31);
    core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffff320,error_code,
               (string *)in_stack_fffffffffffff310);
    local_45 = 0;
    __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (in_RSI != (DecodeRawTransactionResponse *)0x0) {
    local_10 = in_RSI;
    DecodeRawTransactionRequest::GetHex_abi_cxx11_
              ((DecodeRawTransactionRequest *)in_stack_fffffffffffff2f8);
    local_78 = &local_98;
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      local_b0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/jsonapi/cfd_json_transaction.cpp"
                   ,0x2f);
      local_b0.filename = local_b0.filename + 1;
      local_b0.line = 0x4b;
      local_b0.funcname = "DecodeRawTransaction";
      core::logger::warn<>(&local_b0,"Failed to DecodeRawTransactionRequest. hex empty.");
      local_d2 = 1;
      uVar4 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff30,"Invalid hex string. empty data.",&local_d1);
      core::CfdException::CfdException
                ((CfdException *)in_stack_fffffffffffff320,error_code,
                 (string *)in_stack_fffffffffffff310);
      local_d2 = 0;
      __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    DecodeRawTransactionRequest::GetNetwork_abi_cxx11_
              ((DecodeRawTransactionRequest *)in_stack_fffffffffffff2f8);
    NVar3 = ConvertNetType(in_stack_fffffffffffff360);
    std::__cxx11::string::~string(local_f8);
    local_d8 = NVar3;
    core::Transaction::Transaction(&local_138,local_78);
    core::AbstractTransaction::GetTxid(&local_178,&local_138.super_AbstractTransaction);
    core::Txid::GetHex_abi_cxx11_(&local_158,&local_178);
    DecodeRawTransactionResponse::SetTxid
              ((DecodeRawTransactionResponse *)in_stack_fffffffffffff300,
               (string *)in_stack_fffffffffffff2f8);
    std::__cxx11::string::~string((string *)&local_158);
    core::Txid::~Txid((Txid *)0x694f0c);
    core::AbstractTransaction::GetWitnessHash(&local_1d0,&local_138.super_AbstractTransaction);
    core::Txid::Txid(&local_1b8,&local_1d0);
    core::Txid::GetHex_abi_cxx11_(&local_198,&local_1b8);
    DecodeRawTransactionResponse::SetHash
              ((DecodeRawTransactionResponse *)in_stack_fffffffffffff300,
               (string *)in_stack_fffffffffffff2f8);
    std::__cxx11::string::~string((string *)&local_198);
    core::Txid::~Txid((Txid *)0x694f92);
    core::ByteData256::~ByteData256((ByteData256 *)0x694f9f);
    pDVar1 = local_10;
    local_1d4 = core::Transaction::GetTotalSize(&local_138);
    DecodeRawTransactionResponse::SetSize(pDVar1,&local_1d4);
    pDVar1 = local_10;
    local_1d8 = core::Transaction::GetVsize(&local_138);
    DecodeRawTransactionResponse::SetVsize(pDVar1,&local_1d8);
    pDVar1 = local_10;
    local_1dc = core::Transaction::GetWeight(&local_138);
    DecodeRawTransactionResponse::SetWeight(pDVar1,&local_1dc);
    pDVar1 = local_10;
    local_1e0 = core::AbstractTransaction::GetVersion(&local_138.super_AbstractTransaction);
    DecodeRawTransactionResponse::SetVersion(pDVar1,&local_1e0);
    pDVar1 = local_10;
    local_1e4 = core::AbstractTransaction::GetLockTime(&local_138.super_AbstractTransaction);
    DecodeRawTransactionResponse::SetLocktime(pDVar1,&local_1e4);
    core::Transaction::GetTxInList(&local_208,&local_138);
    local_1f0 = &local_208;
    local_210._M_current =
         (TxInReference *)
         std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::begin
                   (local_1f0);
    local_218 = (TxInReference *)
                std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::
                end(local_1f0);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
                               *)in_stack_fffffffffffff300,
                              (__normal_iterator<const_cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
                               *)in_stack_fffffffffffff2f8), bVar2) {
      local_228 = &__gnu_cxx::
                   __normal_iterator<const_cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
                   ::operator*(&local_210)->super_AbstractTxInReference;
      DecodeRawTransactionTxIn::DecodeRawTransactionTxIn(in_stack_fffffffffffff350);
      bVar2 = core::AbstractTransaction::IsCoinBase(&local_138.super_AbstractTransaction);
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_368,"txid",&local_369);
        DecodeRawTransactionTxIn::SetIgnoreItem
                  (in_stack_fffffffffffff310,(string *)in_stack_fffffffffffff308);
        std::__cxx11::string::~string(local_368);
        std::allocator<char>::~allocator((allocator<char> *)&local_369);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_390,"vout",&local_391);
        DecodeRawTransactionTxIn::SetIgnoreItem
                  (in_stack_fffffffffffff310,(string *)in_stack_fffffffffffff308);
        std::__cxx11::string::~string(local_390);
        std::allocator<char>::~allocator((allocator<char> *)&local_391);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3b8,"scriptSig",&local_3b9);
        DecodeRawTransactionTxIn::SetIgnoreItem
                  (in_stack_fffffffffffff310,(string *)in_stack_fffffffffffff308);
        std::__cxx11::string::~string(local_3b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3e0,"txinwitness",&local_3e1);
        DecodeRawTransactionTxIn::SetIgnoreItem
                  (in_stack_fffffffffffff310,(string *)in_stack_fffffffffffff308);
        std::__cxx11::string::~string(local_3e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3e1);
        core::AbstractTxInReference::GetUnlockingScript
                  ((AbstractTxInReference *)in_stack_fffffffffffff2f8);
        bVar2 = core::Script::IsEmpty(&local_420);
        core::Script::~Script((Script *)in_stack_fffffffffffff300);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          core::AbstractTxInReference::GetUnlockingScript
                    ((AbstractTxInReference *)in_stack_fffffffffffff2f8);
          core::Script::GetHex_abi_cxx11_(&local_440,&local_478);
          DecodeRawTransactionTxIn::SetCoinbase
                    ((DecodeRawTransactionTxIn *)in_stack_fffffffffffff300,
                     (string *)in_stack_fffffffffffff2f8);
          std::__cxx11::string::~string((string *)&local_440);
          core::Script::~Script((Script *)in_stack_fffffffffffff300);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_498,"coinbase",&local_499);
        DecodeRawTransactionTxIn::SetIgnoreItem
                  (in_stack_fffffffffffff310,(string *)in_stack_fffffffffffff308);
        std::__cxx11::string::~string(local_498);
        std::allocator<char>::~allocator((allocator<char> *)&local_499);
        core::AbstractTxInReference::GetTxid((AbstractTxInReference *)in_stack_fffffffffffff2f8);
        core::Txid::GetHex_abi_cxx11_(&local_4c0,&local_4e0);
        DecodeRawTransactionTxIn::SetTxid
                  ((DecodeRawTransactionTxIn *)in_stack_fffffffffffff300,
                   (string *)in_stack_fffffffffffff2f8);
        std::__cxx11::string::~string((string *)&local_4c0);
        core::Txid::~Txid((Txid *)0x6957ba);
        local_4e4 = core::AbstractTxInReference::GetVout(local_228);
        DecodeRawTransactionTxIn::SetVout(&local_348,&local_4e4);
        core::AbstractTxInReference::GetUnlockingScript
                  ((AbstractTxInReference *)in_stack_fffffffffffff2f8);
        bVar2 = core::Script::IsEmpty(&local_520);
        core::Script::~Script((Script *)in_stack_fffffffffffff300);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          DecodeRawTransactionTxIn::GetScriptSig(&local_348);
          core::AbstractTxInReference::GetUnlockingScript
                    ((AbstractTxInReference *)in_stack_fffffffffffff2f8);
          core::Script::ToString_abi_cxx11_(&local_540,&local_578);
          DecodeUnlockingScript::SetAsm
                    ((DecodeUnlockingScript *)in_stack_fffffffffffff300,
                     (string *)in_stack_fffffffffffff2f8);
          std::__cxx11::string::~string((string *)&local_540);
          core::Script::~Script((Script *)in_stack_fffffffffffff300);
          DecodeRawTransactionTxIn::GetScriptSig(&local_348);
          core::AbstractTxInReference::GetUnlockingScript
                    ((AbstractTxInReference *)in_stack_fffffffffffff2f8);
          core::Script::GetHex_abi_cxx11_(&local_598,&local_5d0);
          DecodeUnlockingScript::SetHex
                    ((DecodeUnlockingScript *)in_stack_fffffffffffff300,
                     (string *)in_stack_fffffffffffff2f8);
          std::__cxx11::string::~string((string *)&local_598);
          core::Script::~Script((Script *)in_stack_fffffffffffff300);
        }
        core::AbstractTxInReference::GetScriptWitness
                  ((AbstractTxInReference *)in_stack_fffffffffffff2f8);
        core::ScriptWitness::GetWitness(&local_5f0,&local_610);
        core::ScriptWitness::~ScriptWitness((ScriptWitness *)0x695abf);
        local_5d8 = &local_5f0;
        local_618._M_current =
             (ByteData *)
             std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::begin
                       (local_5d8);
        local_620._M_current =
             (ByteData *)
             std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::end(local_5d8);
        while (bVar2 = __gnu_cxx::operator!=(&local_618,&local_620), bVar2) {
          local_628 = __gnu_cxx::
                      __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
                      ::operator*(&local_618);
          pJVar6 = DecodeRawTransactionTxIn::GetTxinwitness_abi_cxx11_(&local_348);
          this = &(pJVar6->
                  super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ;
          core::ByteData::GetHex_abi_cxx11_(&local_648,local_628);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(this,&local_648);
          std::__cxx11::string::~string((string *)&local_648);
          __gnu_cxx::
          __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
          ::operator++(&local_618);
        }
        local_21c = 4;
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
                  ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                   in_stack_fffffffffffff310);
        pJVar6 = DecodeRawTransactionTxIn::GetTxinwitness_abi_cxx11_(&local_348);
        bVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&(pJVar6->
                         super_JsonVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       );
        if (bVar2) {
          in_stack_fffffffffffff350 = (DecodeRawTransactionTxIn *)local_669;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_669 + 1),"txinwitness",(allocator *)in_stack_fffffffffffff350)
          ;
          DecodeRawTransactionTxIn::SetIgnoreItem
                    (in_stack_fffffffffffff310,(string *)in_stack_fffffffffffff308);
          std::__cxx11::string::~string((string *)(local_669 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_669);
        }
      }
      local_670 = core::AbstractTxInReference::GetSequence(local_228);
      DecodeRawTransactionTxIn::SetSequence(&local_348,&local_670);
      DecodeRawTransactionResponse::GetVin(local_10);
      std::
      vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
      ::push_back((vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
                   *)in_stack_fffffffffffff310,in_stack_fffffffffffff308);
      DecodeRawTransactionTxIn::~DecodeRawTransactionTxIn
                ((DecodeRawTransactionTxIn *)in_stack_fffffffffffff300);
      __gnu_cxx::
      __normal_iterator<const_cfd::core::TxInReference_*,_std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>_>
      ::operator++(&local_210);
    }
    local_21c = 2;
    std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::~vector
              ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
               in_stack_fffffffffffff310);
    local_674 = 0;
    core::Transaction::GetTxOutList(&local_698,&local_138);
    local_680 = &local_698;
    local_6a0._M_current =
         (TxOutReference *)
         std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::begin
                   (local_680);
    local_6a8 = (TxOutReference *)
                std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::
                end(local_680);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_cfd::core::TxOutReference_*,_std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>_>
                               *)in_stack_fffffffffffff300,
                              (__normal_iterator<const_cfd::core::TxOutReference_*,_std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>_>
                               *)in_stack_fffffffffffff2f8), bVar2) {
      local_6b0 = &__gnu_cxx::
                   __normal_iterator<const_cfd::core::TxOutReference_*,_std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>_>
                   ::operator*(&local_6a0)->super_AbstractTxOutReference;
      DecodeRawTransactionTxOut::DecodeRawTransactionTxOut(in_stack_fffffffffffff320);
      AVar7 = core::AbstractTxOutReference::GetValue(local_6b0);
      local_7e0 = AVar7.amount_;
      local_7d8 = AVar7.ignore_check_;
      local_7d0.amount_ = local_7e0;
      local_7d0.ignore_check_ = (bool)local_7d8;
      local_7c0 = core::Amount::GetSatoshiValue(&local_7d0);
      DecodeRawTransactionTxOut::SetValue(&local_7b8,&local_7c0);
      local_7e4 = local_674;
      DecodeRawTransactionTxOut::SetN(&local_7b8,&local_7e4);
      DecodeLockingScript::DecodeLockingScript((DecodeLockingScript *)in_stack_fffffffffffff350);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x695f11);
      core::AbstractTxOutReference::GetLockingScript
                ((AbstractTxOutReference *)in_stack_fffffffffffff2f8);
      core::Script::GetHex_abi_cxx11_(&local_918,&local_8f8);
      DecodeLockingScript::SetHex
                ((DecodeLockingScript *)in_stack_fffffffffffff300,
                 (string *)in_stack_fffffffffffff2f8);
      std::__cxx11::string::~string((string *)&local_918);
      core::Script::ToString_abi_cxx11_((string *)(local_988 + 0x50),&local_8f8);
      DecodeLockingScript::SetAsm
                ((DecodeLockingScript *)in_stack_fffffffffffff300,
                 (string *)in_stack_fffffffffffff2f8);
      std::__cxx11::string::~string((string *)(local_988 + 0x50));
      AddressFactory::AddressFactory
                ((AddressFactory *)in_stack_fffffffffffff300,
                 (NetType)((ulong)in_stack_fffffffffffff2f8 >> 0x20));
      local_988._32_8_ = (_Base_ptr)0x0;
      in_stack_fffffffffffff320 = (DecodeRawTransactionTxOut *)local_988;
      std::__cxx11::string::string((string *)in_stack_fffffffffffff320);
      ConvertFromLockingScript
                (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                 in_stack_ffffffffffffff30);
      DecodeLockingScript::SetType
                ((DecodeLockingScript *)in_stack_fffffffffffff300,
                 (string *)in_stack_fffffffffffff2f8);
      local_9a4 = local_988._32_4_;
      DecodeLockingScript::SetReqSigs(&local_8a8,&local_9a4);
      bVar2 = std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::empty
                        ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                         in_stack_fffffffffffff310);
      if (bVar2) {
        paVar8 = &local_9c9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_9c8,"reqSigs",paVar8);
        DecodeLockingScript::SetIgnoreItem
                  ((DecodeLockingScript *)in_stack_fffffffffffff310,
                   (string *)in_stack_fffffffffffff308);
        std::__cxx11::string::~string(local_9c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_9c9);
        in_stack_fffffffffffff310 = (DecodeRawTransactionTxIn *)local_9f1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_9f1 + 1),"addresses",(allocator *)in_stack_fffffffffffff310);
        DecodeLockingScript::SetIgnoreItem
                  ((DecodeLockingScript *)in_stack_fffffffffffff310,
                   (string *)in_stack_fffffffffffff308);
        std::__cxx11::string::~string((string *)(local_9f1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_9f1);
      }
      else {
        local_a00 = &local_9a0;
        local_a08._M_current =
             (Address *)
             std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::begin(local_a00);
        local_a10 = (Address *)
                    std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::end
                              (local_a00);
        while (bVar2 = __gnu_cxx::operator!=
                                 ((__normal_iterator<cfd::core::Address_*,_std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>_>
                                   *)in_stack_fffffffffffff300,
                                  (__normal_iterator<cfd::core::Address_*,_std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>_>
                                   *)in_stack_fffffffffffff2f8), bVar2) {
          object = __gnu_cxx::
                   __normal_iterator<cfd::core::Address_*,_std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>_>
                   ::operator*(&local_a08);
          core::Address::Address(&local_b88,object);
          in_stack_fffffffffffff308 =
               (value_type *)DecodeLockingScript::GetAddresses_abi_cxx11_(&local_8a8);
          in_stack_fffffffffffff300 = (Address *)&in_stack_fffffffffffff308->ignore_items;
          core::Address::GetAddress_abi_cxx11_(&local_ba8,&local_b88);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff300,&local_ba8);
          std::__cxx11::string::~string((string *)&local_ba8);
          core::Address::~Address(in_stack_fffffffffffff300);
          __gnu_cxx::
          __normal_iterator<cfd::core::Address_*,_std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>_>
          ::operator++(&local_a08);
        }
      }
      DecodeRawTransactionTxOut::SetScriptPubKey
                ((DecodeRawTransactionTxOut *)in_stack_fffffffffffff300,in_stack_fffffffffffff2f8);
      in_stack_fffffffffffff2f8 =
           (DecodeLockingScript *)DecodeRawTransactionResponse::GetVout(local_10);
      std::
      vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
      ::push_back((vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
                   *)in_stack_fffffffffffff310,(value_type *)in_stack_fffffffffffff308);
      local_674 = local_674 + 1;
      std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::~vector
                ((vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *)
                 in_stack_fffffffffffff310);
      std::__cxx11::string::~string((string *)local_988);
      AddressFactory::~AddressFactory((AddressFactory *)0x696439);
      core::Script::~Script((Script *)in_stack_fffffffffffff300);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff310);
      DecodeLockingScript::~DecodeLockingScript((DecodeLockingScript *)in_stack_fffffffffffff300);
      DecodeRawTransactionTxOut::~DecodeRawTransactionTxOut
                ((DecodeRawTransactionTxOut *)in_stack_fffffffffffff300);
      __gnu_cxx::
      __normal_iterator<const_cfd::core::TxOutReference_*,_std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>_>
      ::operator++(&local_6a0);
    }
    local_21c = 6;
    std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
              ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
               in_stack_fffffffffffff310);
    core::Transaction::~Transaction((Transaction *)in_stack_fffffffffffff300);
    std::__cxx11::string::~string((string *)&local_98);
    return;
  }
  local_6a = 1;
  uVar4 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"response is null.",&local_69);
  core::CfdException::CfdException
            ((CfdException *)in_stack_fffffffffffff320,error_code,
             (string *)in_stack_fffffffffffff310);
  local_6a = 0;
  __cxa_throw(uVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void TransactionJsonApi::DecodeRawTransaction(
    DecodeRawTransactionRequest* request,
    DecodeRawTransactionResponse* response) {
  if (request == nullptr) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "request is null.");
  }
  if (response == nullptr) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "response is null.");
  }
  // validate version number
  const std::string& hex_string = request->GetHex();
  if (hex_string.empty()) {
    warn(
        CFD_LOG_SOURCE, "Failed to DecodeRawTransactionRequest. hex empty.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Invalid hex string. empty data.");
  }
  // TODO(k-matsuzawa): iswitness未使用。bitcoincoreの指定方法が不明瞭

  NetType net_type = ConvertNetType(request->GetNetwork());

  // TransactionController作成
  Transaction tx(hex_string);

  response->SetTxid(tx.GetTxid().GetHex());
  response->SetHash(Txid(tx.GetWitnessHash()).GetHex());
  response->SetSize(tx.GetTotalSize());
  response->SetVsize(tx.GetVsize());
  response->SetWeight(tx.GetWeight());
  response->SetVersion(tx.GetVersion());
  response->SetLocktime(tx.GetLockTime());

  // TxInの追加
  for (const TxInReference& tx_in_ref : tx.GetTxInList()) {
    DecodeRawTransactionTxIn res_txin;
    if (tx.IsCoinBase()) {
      res_txin.SetIgnoreItem("txid");
      res_txin.SetIgnoreItem("vout");
      res_txin.SetIgnoreItem("scriptSig");
      res_txin.SetIgnoreItem("txinwitness");

      if (!tx_in_ref.GetUnlockingScript().IsEmpty()) {
        res_txin.SetCoinbase(tx_in_ref.GetUnlockingScript().GetHex());
      }
    } else {
      res_txin.SetIgnoreItem("coinbase");

      res_txin.SetTxid(tx_in_ref.GetTxid().GetHex());
      res_txin.SetVout(tx_in_ref.GetVout());
      if (!tx_in_ref.GetUnlockingScript().IsEmpty()) {
        res_txin.GetScriptSig().SetAsm(tx_in_ref.GetUnlockingScript().ToString());
        res_txin.GetScriptSig().SetHex(tx_in_ref.GetUnlockingScript().GetHex());
      }
      for (const ByteData& witness :
           tx_in_ref.GetScriptWitness().GetWitness()) {  // NOLINT
        res_txin.GetTxinwitness().push_back(witness.GetHex());
      }
      if (res_txin.GetTxinwitness().empty()) {
        // txinwitnessを除外
        res_txin.SetIgnoreItem("txinwitness");
      }
    }
    res_txin.SetSequence(tx_in_ref.GetSequence());
    response->GetVin().push_back(res_txin);
  }

  // TxOutの追加
  int32_t txout_count = 0;
  for (const TxOutReference& txout_ref : tx.GetTxOutList()) {
    DecodeRawTransactionTxOut res_txout;
    res_txout.SetValue(txout_ref.GetValue().GetSatoshiValue());
    res_txout.SetN(txout_count);

    DecodeLockingScript script_pub_key_res;
    std::vector<std::string> addresses;
    Script locking_script = txout_ref.GetLockingScript();
    script_pub_key_res.SetHex(locking_script.GetHex());
    script_pub_key_res.SetAsm(locking_script.ToString());

    AddressFactory addr_factory(net_type);
    int64_t require_num = 0;
    std::string script_type;
    auto addr_list = TransactionJsonApi::ConvertFromLockingScript(
        addr_factory, locking_script, &script_type, &require_num);
    script_pub_key_res.SetType(script_type);
    script_pub_key_res.SetReqSigs(require_num);
    if (addr_list.empty()) {
      script_pub_key_res.SetIgnoreItem("reqSigs");
      script_pub_key_res.SetIgnoreItem("addresses");
    } else {
      for (auto addr : addr_list) {
        script_pub_key_res.GetAddresses().push_back(addr.GetAddress());
      }
    }
    res_txout.SetScriptPubKey(script_pub_key_res);

    response->GetVout().push_back(res_txout);
    ++txout_count;
  }
}